

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::TracerRealTime::display(TracerRealTime *this,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  sbyte sVar7;
  long *plVar8;
  allocator<char> local_71;
  undefined1 *local_70;
  undefined8 local_68;
  long *local_60;
  double local_58;
  string unit;
  
  poVar4 = std::operator<<(os,(string *)&CLASS_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)&this->field_0x8);
  poVar4 = std::operator<<(poVar4," [mode=");
  pcVar6 = "pause";
  if (this->field_0x1c0 != '\0') {
    pcVar6 = "play";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4,"] : ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"  - Dep list: ");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_60 = (long *)&this->field_0x190;
  plVar8 = (long *)&this->field_0xd8;
  local_70 = (undefined1 *)plVar8;
  while (plVar8 = (long *)*plVar8, (long *)local_70 != plVar8) {
    local_60 = (long *)*local_60;
    if (local_60[2] == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(local_60[2],&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
    }
    poVar4 = std::operator<<(os,"     -> ");
    std::operator<<(poVar4,(string *)(plVar8[2] + 8));
    if (*(long *)(lVar5 + 0x98) != 0) {
      poVar4 = std::operator<<(os," (in ");
      poVar4 = std::operator<<(poVar4,(string *)(lVar5 + 0x90));
      std::operator<<(poVar4,")");
    }
    std::operator<<(os,"\t");
    local_68 = *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]);
    uVar1 = *(ulong *)(lVar5 + 0x78);
    uVar2 = *(ulong *)(lVar5 + 0x80);
    std::__cxx11::string::string<std::allocator<char>>((string *)&unit,"",&local_71);
    if (uVar1 < 0x40000000 && uVar2 < 0x40000000) {
      if (uVar1 < 0x100000 && uVar2 < 0x100000) {
        sVar7 = 0;
        if (0x3ff < uVar1 || 0x3ff < uVar2) {
          std::__cxx11::string::assign((char *)&unit);
          sVar7 = 10;
        }
      }
      else {
        std::__cxx11::string::assign((char *)&unit);
        sVar7 = 0x14;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&unit);
      sVar7 = 0x1e;
    }
    poVar4 = std::operator<<(os,"[");
    pp_Var3 = poVar4->_vptr_basic_ostream;
    *(undefined8 *)(&poVar4->field_0x10 + (long)pp_Var3[-3]) = 1;
    *(undefined8 *)(&poVar4->field_0x8 + (long)pp_Var3[-3]) = 1;
    local_58 = (double)(1 << sVar7);
    poVar4 = std::ostream::_M_insert<double>((double)(long)uVar1 / local_58);
    poVar4 = std::operator<<(poVar4,(string *)&unit);
    poVar4 = std::operator<<(poVar4,"/");
    *(undefined8 *)(&poVar4->field_0x8 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    poVar4 = std::ostream::_M_insert<double>((double)(long)uVar2 / local_58);
    poVar4 = std::operator<<(poVar4,(string *)&unit);
    std::operator<<(poVar4,"]\t");
    if (*(char *)(lVar5 + 0x88) == '\x01') {
      std::operator<<(os,"(FULL)");
    }
    *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = local_68;
    std::__cxx11::string::~string((string *)&unit);
    std::endl<char,std::char_traits<char>>(os);
  }
  return;
}

Assistant:

void TracerRealTime::display(std::ostream &os) const {
  os << CLASS_NAME << " " << name << " [mode=" << (play ? "play" : "pause")
     << "] : " << endl
     << "  - Dep list: " << endl;

  FileList::const_iterator iterFile = files.begin();
  for (SignalList::const_iterator iter = toTraceSignals.begin();
       toTraceSignals.end() != iter; ++iter) {
    dgDEBUG(35) << "Next" << endl;
    const OutStringStream *file = dynamic_cast<OutStringStream *>(*iterFile);
    os << "     -> " << (*iter)->getName();
    if (file->givenname.length()) os << " (in " << file->givenname << ")";
    os << "\t";
    if (file) {
      const std::streamsize PRECISION = os.precision();
      const std::streamsize SIZE = file->index;
      const std::streamsize MSIZE = file->bufferSize;
      unsigned int dec = 0;
      std::string unit = "";
      if ((SIZE >> 30) || (MSIZE >> 30)) {
        dec = 30;
        unit = "Go";
      } else if ((SIZE >> 20) || (MSIZE >> 20)) {
        dec = 20;
        unit = "Mo";
      } else if ((SIZE >> 10) || (MSIZE >> 10)) {
        dec = 10;
        unit = "Ko";
      }
      os << "[" << std::setw(1) << std::setprecision(1)
         << (((double)SIZE + 0.0) / (1 << dec)) << unit << "/"
         << std::setprecision(2) << (((double)MSIZE + 0.0) / (1 << dec)) << unit
         << "]\t";
      if (file->full) os << "(FULL)";
      os.precision(PRECISION);
    }
    os << endl;
    ++iterFile;
  }
}